

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::yml::Tree::duplicate_children_no_rep
          (Tree *this,Tree *src,size_t node,size_t parent,size_t after)

{
  code *pcVar1;
  Location LVar2;
  undefined1 auVar3 [24];
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  size_t node_00;
  csubstr *this_00;
  csubstr *pcVar11;
  long lVar12;
  ulong uVar13;
  Tree *src_00;
  char msg [29];
  char local_158 [32];
  undefined8 local_138;
  undefined2 uStack_130;
  undefined6 local_12e;
  undefined2 uStack_128;
  char acStack_126 [14];
  Tree *local_118;
  size_t local_110;
  ulong local_108;
  long local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_158,"check failed: (node != NONE)",0x1d);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar1 = (code *)swi(3);
      sVar10 = (*pcVar1)();
      return sVar10;
    }
    local_58 = 0;
    uStack_50 = 0x65de;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x65de) << 0x40);
    LVar2.name.str._0_4_ = 0x24bb3d;
    LVar2.super_LineCol.offset = auVar3._0_8_;
    LVar2.super_LineCol.line = auVar3._8_8_;
    LVar2.super_LineCol.col = auVar3._16_8_;
    LVar2.name.str._4_4_ = 0;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_158,0x1d,LVar2,(this->m_callbacks).m_user_data);
  }
  if (parent == 0xffffffffffffffff) {
    builtin_strncpy(local_158,"check failed: (parent != NONE)",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar1 = (code *)swi(3);
      sVar10 = (*pcVar1)();
      return sVar10;
    }
    local_80 = 0;
    uStack_78 = 0x65df;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x65df) << 0x40);
    LVar4.name.str._0_4_ = 0x24bb3d;
    LVar4.super_LineCol.offset = auVar3._0_8_;
    LVar4.super_LineCol.line = auVar3._8_8_;
    LVar4.super_LineCol.col = auVar3._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_158,0x1f,LVar4,(this->m_callbacks).m_user_data);
  }
  local_108 = 0xffffffffffffffff;
  if (after != 0xffffffffffffffff) {
    bVar8 = has_child(this,parent,after);
    if (!bVar8) {
      uStack_128 = 0x202c;
      builtin_strncpy(acStack_126,"after))",8);
      local_138._0_1_ = 'h';
      local_138._1_1_ = 'a';
      local_138._2_1_ = 's';
      local_138._3_1_ = '_';
      local_138._4_1_ = 'c';
      local_138._5_1_ = 'h';
      local_138._6_1_ = 'i';
      local_138._7_1_ = 'l';
      uStack_130 = 0x2864;
      local_12e = 0x746e65726170;
      builtin_strncpy(local_158,"check failed: (after == NONE || ",0x20);
      if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
        pcVar1 = (code *)swi(3);
        sVar10 = (*pcVar1)();
        return sVar10;
      }
      local_a8 = 0;
      uStack_a0 = 0x65e0;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      auVar3 = ZEXT1224(ZEXT412(0x65e0) << 0x40);
      LVar5.name.str._0_4_ = 0x24bb3d;
      LVar5.super_LineCol.offset = auVar3._0_8_;
      LVar5.super_LineCol.line = auVar3._8_8_;
      LVar5.super_LineCol.col = auVar3._16_8_;
      LVar5.name.str._4_4_ = 0;
      LVar5.name.len = 0x65;
      (*(this->m_callbacks).m_error)(local_158,0x3a,LVar5,(this->m_callbacks).m_user_data);
    }
    sVar10 = first_child(this,parent);
    if (sVar10 != 0xffffffffffffffff) {
      lVar12 = 0;
      do {
        if (sVar10 == after) {
          if (lVar12 != 1) {
            local_108 = -lVar12;
            goto LAB_0020cf97;
          }
          break;
        }
        sVar10 = next_sibling(this,sVar10);
        lVar12 = lVar12 + -1;
      } while (sVar10 != 0xffffffffffffffff);
    }
    builtin_strncpy(local_158,"check failed: (after_pos != NONE",0x20);
    local_138._0_2_ = 0x29;
    if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
      pcVar1 = (code *)swi(3);
      sVar10 = (*pcVar1)();
      return sVar10;
    }
    local_d0 = 0;
    uStack_c8 = 0x65f0;
    local_c0 = 0;
    pcStack_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b0 = 0x65;
    auVar3 = ZEXT1224(ZEXT412(0x65f0) << 0x40);
    LVar6.name.str._0_4_ = 0x24bb3d;
    LVar6.super_LineCol.offset = auVar3._0_8_;
    LVar6.super_LineCol.line = auVar3._8_8_;
    LVar6.super_LineCol.col = auVar3._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_158,0x22,LVar6,(this->m_callbacks).m_user_data);
  }
LAB_0020cf97:
  sVar10 = first_child(src,node);
  if (sVar10 != 0xffffffffffffffff) {
    local_100 = parent * 0x90;
    local_118 = src;
    do {
      if ((parent == 0xffffffffffffffff) || (this->m_cap <= parent)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
          pcVar1 = (code *)swi(3);
          sVar10 = (*pcVar1)();
          return sVar10;
        }
        local_158[0] = '\0';
        local_158[1] = '\0';
        local_158[2] = '\0';
        local_158[3] = '\0';
        local_158[4] = '\0';
        local_158[5] = '\0';
        local_158[6] = '\0';
        local_158[7] = '\0';
        local_158[8] = -0x7a;
        local_158[9] = 'K';
        local_158[10] = '\0';
        local_158[0xb] = '\0';
        local_158[0xc] = 0;
        local_158[0xd] = '\0';
        local_158[0xe] = '\0';
        local_158[0xf] = 0;
        local_158[0x10] = '\0';
        local_158[0x11] = '\0';
        local_158[0x12] = '\0';
        local_158[0x13] = '\0';
        local_158[0x14] = 0;
        local_158[0x15] = '\0';
        local_158[0x16] = '\0';
        local_158[0x17] = 0;
        local_158[0x18] = '=';
        local_158[0x19] = -0x45;
        local_158[0x1a] = '$';
        local_158[0x1b] = '\0';
        local_158[0x1c] = 0;
        local_158[0x1d] = '\0';
        local_158[0x1e] = '\0';
        local_158[0x1f] = 0;
        local_138._0_1_ = 'e';
        local_138._1_1_ = '\0';
        local_138._2_1_ = '\0';
        local_138._3_1_ = '\0';
        local_138._4_1_ = '\0';
        local_138._5_1_ = '\0';
        local_138._6_1_ = '\0';
        local_138._7_1_ = '\0';
        (*(code *)PTR_error_impl_0029d7a8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      uVar13 = *(ulong *)((long)&(this->m_buf->m_type).type + local_100);
      src_00 = this;
      if ((uVar13 & 8) == 0) {
        if ((parent == 0xffffffffffffffff) || (this->m_cap <= parent)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            pcVar1 = (code *)swi(3);
            sVar10 = (*pcVar1)();
            return sVar10;
          }
          local_158[0] = '\0';
          local_158[1] = '\0';
          local_158[2] = '\0';
          local_158[3] = '\0';
          local_158[4] = '\0';
          local_158[5] = '\0';
          local_158[6] = '\0';
          local_158[7] = '\0';
          local_158[8] = -0x7a;
          local_158[9] = 'K';
          local_158[10] = '\0';
          local_158[0xb] = '\0';
          local_158[0xc] = 0;
          local_158[0xd] = '\0';
          local_158[0xe] = '\0';
          local_158[0xf] = 0;
          local_158[0x10] = '\0';
          local_158[0x11] = '\0';
          local_158[0x12] = '\0';
          local_158[0x13] = '\0';
          local_158[0x14] = 0;
          local_158[0x15] = '\0';
          local_158[0x16] = '\0';
          local_158[0x17] = 0;
          local_158[0x18] = '=';
          local_158[0x19] = -0x45;
          local_158[0x1a] = '$';
          local_158[0x1b] = '\0';
          local_158[0x1c] = 0;
          local_158[0x1d] = '\0';
          local_158[0x1e] = '\0';
          local_158[0x1f] = 0;
          local_138._0_1_ = 'e';
          local_138._1_1_ = '\0';
          local_138._2_1_ = '\0';
          local_138._3_1_ = '\0';
          local_138._4_1_ = '\0';
          local_138._5_1_ = '\0';
          local_138._6_1_ = '\0';
          local_138._7_1_ = '\0';
          (*(code *)PTR_error_impl_0029d7a8)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
          uVar13 = *(ulong *)((long)&(this->m_buf->m_type).type + local_100);
        }
        if ((uVar13 & 4) == 0) {
          builtin_strncpy(local_158,"check failed: (is_map(parent))",0x1f);
          if ((((byte)s_error_flags & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            pcVar1 = (code *)swi(3);
            sVar10 = (*pcVar1)();
            return sVar10;
          }
          local_f8 = 0;
          uStack_f0 = 0x65fd;
          local_e8 = 0;
          pcStack_e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_d8 = 0x65;
          auVar3 = ZEXT1224(ZEXT412(0x65fd) << 0x40);
          LVar7.name.str._0_4_ = 0x24bb3d;
          LVar7.super_LineCol.offset = auVar3._0_8_;
          LVar7.super_LineCol.line = auVar3._8_8_;
          LVar7.super_LineCol.col = auVar3._16_8_;
          LVar7.name.str._4_4_ = 0;
          LVar7.name.len = 0x65;
          (*(this->m_callbacks).m_error)(local_158,0x1f,LVar7,(this->m_callbacks).m_user_data);
        }
        local_110 = after;
        node_00 = first_child(this,parent);
        src = local_118;
        src_00 = local_118;
        after = local_110;
        if (node_00 != 0xffffffffffffffff) {
          uVar13 = 0;
          do {
            this_00 = key(this,node_00);
            pcVar11 = key(this,sVar10);
            iVar9 = basic_substring<const_char>::compare(this_00,pcVar11->str,pcVar11->len);
            src = local_118;
            if (iVar9 == 0) {
              if (local_108 <= uVar13 || local_108 == 0xffffffffffffffff) {
                after = node_00;
                if ((local_110 != 0xffffffffffffffff) && (after = local_110, node_00 != local_110))
                {
                  move(this,node_00,local_110);
                  after = node_00;
                }
                goto LAB_0020d225;
              }
              remove_children(this,node_00);
              _release(this,node_00);
              src = local_118;
              src_00 = local_118;
              after = local_110;
              break;
            }
            uVar13 = uVar13 + 1;
            node_00 = next_sibling(this,node_00);
            src = local_118;
            src_00 = local_118;
            after = local_110;
          } while (node_00 != 0xffffffffffffffff);
        }
      }
      after = duplicate(this,src_00,sVar10,parent,after);
LAB_0020d225:
      sVar10 = next_sibling(src,sVar10);
    } while (sVar10 != 0xffffffffffffffff);
  }
  return after;
}

Assistant:

size_t Tree::duplicate_children_no_rep(Tree const *src, size_t node, size_t parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, after == NONE || has_child(parent, after));

    // don't loop using pointers as there may be a relocation

    // find the position where "after" is
    size_t after_pos = NONE;
    if(after != NONE)
    {
        for(size_t i = first_child(parent), icount = 0; i != NONE; ++icount, i = next_sibling(i))
        {
            if(i == after)
            {
                after_pos = icount;
                break;
            }
        }
        _RYML_CB_ASSERT(m_callbacks, after_pos != NONE);
    }

    // for each child to be duplicated...
    size_t prev = after;
    for(size_t i = src->first_child(node), icount = 0; i != NONE; ++icount, i = src->next_sibling(i))
    {
        if(is_seq(parent))
        {
            prev = duplicate(i, parent, prev);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(parent));
            // does the parent already have a node with key equal to that of the current duplicate?
            size_t rep = NONE, rep_pos = NONE;
            for(size_t j = first_child(parent), jcount = 0; j != NONE; ++jcount, j = next_sibling(j))
            {
                if(key(j) == key(i))
                {
                    rep = j;
                    rep_pos = jcount;
                    break;
                }
            }
            if(rep == NONE) // there is no repetition; just duplicate
            {
                prev = duplicate(src, i, parent, prev);
            }
            else  // yes, there is a repetition
            {
                if(after_pos != NONE && rep_pos < after_pos)
                {
                    // rep is located before the node which will be inserted,
                    // and will be overridden by the duplicate. So replace it.
                    remove(rep);
                    prev = duplicate(src, i, parent, prev);
                }
                else if(prev == NONE)
                {
                    // first iteration with prev = after = NONE and repetition
                    prev = rep;
                }
                else if(rep != prev)
                {
                    // rep is located after the node which will be inserted
                    // and overrides it. So move the rep into this node's place.
                    move(rep, prev);
                    prev = rep;
                }
            } // there's a repetition
        }
    }

    return prev;
}